

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thermoParser.h
# Opt level: O2

void __thiscall IO::ThermoParser::~ThermoParser(ThermoParser *this)

{
  std::vector<IO::Thermo,_std::allocator<IO::Thermo>_>::~vector(&this->thermos_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->lines_);
  std::__cxx11::string::~string((string *)&this->thermo_file_string_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~ThermoParser() {
        }